

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O3

void __thiscall
cfd::core::Address::Address
          (Address *this,NetType_conflict type,WitnessVersion witness_ver,ByteData *hash)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Rb_tree_header *p_Var2;
  WitnessVersion WVar3;
  pointer puVar4;
  size_t sVar5;
  CfdException *this_00;
  string local_98;
  CfdSourceLocation local_78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  Pubkey *local_48;
  ByteData *local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  this->type_ = type;
  this->addr_type_ = kP2wshAddress;
  this->witness_ver_ = witness_ver;
  paVar1 = &(this->address_).field_2;
  (this->address_)._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&this->address_,"");
  local_38 = paVar1;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->hash_,&hash->data_);
  local_40 = &this->hash_;
  Pubkey::Pubkey(&this->pubkey_);
  local_48 = &this->pubkey_;
  SchnorrPubkey::SchnorrPubkey(&this->schnorr_pubkey_);
  TaprootScriptTree::TaprootScriptTree(&this->script_tree_);
  Script::Script(&this->redeem_script_);
  p_Var2 = &(this->format_data_).map_._M_t._M_impl.super__Rb_tree_header;
  *(undefined8 *)&(this->format_data_).map_._M_t._M_impl = 0;
  *(undefined8 *)&(this->format_data_).map_._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->format_data_).map_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->format_data_).map_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  (this->format_data_).map_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  (this->format_data_).map_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->checksum_[0] = '\0';
  this->checksum_[1] = '\0';
  this->checksum_[2] = '\0';
  this->checksum_[3] = '\0';
  WVar3 = this->witness_ver_;
  if (WVar3 == kVersionNone) {
    return;
  }
  if (WVar3 == kVersion1) {
    sVar5 = ByteData::GetDataSize(hash);
    if (sVar5 != 0x20) goto LAB_0033e2a3;
    this->addr_type_ = kTaprootAddress;
    SchnorrPubkey::SchnorrPubkey((SchnorrPubkey *)&local_98,hash);
    puVar4 = (this->schnorr_pubkey_).data_.data_.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    (this->schnorr_pubkey_).data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_98._M_dataplus._M_p;
    (this->schnorr_pubkey_).data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_98._M_string_length;
    (this->schnorr_pubkey_).data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_98.field_2._M_allocated_capacity;
    local_98._M_dataplus._M_p = (pointer)0x0;
    local_98._M_string_length = 0;
    local_98.field_2._M_allocated_capacity = 0;
    if ((puVar4 != (pointer)0x0) &&
       (operator_delete(puVar4), local_98._M_dataplus._M_p != (pointer)0x0)) {
      operator_delete(local_98._M_dataplus._M_p);
    }
  }
  else {
    if (WVar3 == kVersion0) {
      sVar5 = ByteData::GetDataSize(hash);
      if (sVar5 == 0x14) {
        this->addr_type_ = kP2wpkhAddress;
        ByteData::GetBytes(&local_60,hash);
        ByteData160::ByteData160((ByteData160 *)&local_78,&local_60);
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"");
        CalculateP2WPKH(this,(ByteData160 *)&local_78,&local_98);
      }
      else {
        sVar5 = ByteData::GetDataSize(hash);
        if (sVar5 != 0x20) {
          local_78.filename = "cfdcore_address.cpp";
          local_78.line = 0x2eb;
          local_78.funcname = "Address";
          ByteData::GetHex_abi_cxx11_(&local_98,hash);
          logger::log<std::__cxx11::string&>
                    (&local_78,kCfdLogLevelInfo,"illegal hash data. hash={}",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_98)
          ;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p);
          }
          this_00 = (CfdException *)__cxa_allocate_exception(0x30);
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_98,"hash value error.","");
          CfdException::CfdException(this_00,kCfdIllegalArgumentError,&local_98);
          __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
        }
        this->addr_type_ = kP2wshAddress;
        ByteData::GetBytes(&local_60,hash);
        ByteData256::ByteData256((ByteData256 *)&local_78,&local_60);
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"");
        CalculateP2WSH(this,(ByteData256 *)&local_78,&local_98);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p);
      }
      if (local_78.filename != (char *)0x0) {
        operator_delete(local_78.filename);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        return;
      }
      goto LAB_0033e2e8;
    }
LAB_0033e2a3:
    this->addr_type_ = kWitnessUnknown;
  }
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"");
  CalculateBech32m(this,hash,&local_98);
  local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_98._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p == &local_98.field_2) {
    return;
  }
LAB_0033e2e8:
  operator_delete(local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start);
  return;
}

Assistant:

Address::Address(
    NetType type, WitnessVersion witness_ver, const ByteData& hash)
    : type_(type),
      addr_type_(AddressType::kP2wshAddress),
      witness_ver_(witness_ver),
      address_(""),
      hash_(hash),
      pubkey_(),
      schnorr_pubkey_(),
      redeem_script_() {
  memset(checksum_, 0, sizeof(checksum_));

  if (witness_ver_ == WitnessVersion::kVersion0) {
    if (hash.GetDataSize() == kByteData160Length) {
      SetAddressType(kP2wpkhAddress);
      CalculateP2WPKH(ByteData160(hash.GetBytes()));
    } else if (hash.GetDataSize() == kByteData256Length) {
      SetAddressType(kP2wshAddress);
      CalculateP2WSH(ByteData256(hash.GetBytes()));
    } else {
      // format error
      info(CFD_LOG_SOURCE, "illegal hash data. hash={}", hash.GetHex());
      throw CfdException(kCfdIllegalArgumentError, "hash value error.");
    }
  } else if (witness_ver_ != WitnessVersion::kVersionNone) {
    if ((witness_ver_ == WitnessVersion::kVersion1) &&
        (hash.GetDataSize() == SchnorrPubkey::kSchnorrPubkeySize)) {
      SetAddressType(kTaprootAddress);
      schnorr_pubkey_ = SchnorrPubkey(hash);
    } else {
      SetAddressType(kWitnessUnknown);
    }
    CalculateBech32m(hash);
  }
}